

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::DummyDataParameter::SerializeWithCachedSizes
          (DummyDataParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  FillerParameter *value;
  BlobShape *value_00;
  UnknownFieldSet *unknown_fields;
  uint local_58;
  uint n_5;
  uint i_5;
  int n_4;
  int i_4;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  DummyDataParameter *this_local;
  
  i_1 = 0;
  uVar1 = data_filler_size(this);
  for (; (uint)i_1 < uVar1; i_1 = i_1 + 1) {
    value = data_filler(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (1,(MessageLite *)value,output);
  }
  i_2 = 0;
  iVar2 = num_size(this);
  for (; i_2 < iVar2; i_2 = i_2 + 1) {
    uVar3 = num(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteUInt32(2,uVar3,output);
  }
  i_3 = 0;
  iVar2 = channels_size(this);
  for (; i_3 < iVar2; i_3 = i_3 + 1) {
    uVar3 = channels(this,i_3);
    google::protobuf::internal::WireFormatLite::WriteUInt32(3,uVar3,output);
  }
  i_4 = 0;
  iVar2 = height_size(this);
  for (; i_4 < iVar2; i_4 = i_4 + 1) {
    uVar3 = height(this,i_4);
    google::protobuf::internal::WireFormatLite::WriteUInt32(4,uVar3,output);
  }
  i_5 = 0;
  iVar2 = width_size(this);
  for (; (int)i_5 < iVar2; i_5 = i_5 + 1) {
    uVar3 = width(this,i_5);
    google::protobuf::internal::WireFormatLite::WriteUInt32(5,uVar3,output);
  }
  local_58 = 0;
  uVar1 = shape_size(this);
  for (; local_58 < uVar1; local_58 = local_58 + 1) {
    value_00 = shape(this,local_58);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (6,(MessageLite *)value_00,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = DummyDataParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void DummyDataParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.DummyDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .caffe.FillerParameter data_filler = 1;
  for (unsigned int i = 0, n = this->data_filler_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1, this->data_filler(i), output);
  }

  // repeated uint32 num = 2;
  for (int i = 0, n = this->num_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      2, this->num(i), output);
  }

  // repeated uint32 channels = 3;
  for (int i = 0, n = this->channels_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      3, this->channels(i), output);
  }

  // repeated uint32 height = 4;
  for (int i = 0, n = this->height_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      4, this->height(i), output);
  }

  // repeated uint32 width = 5;
  for (int i = 0, n = this->width_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      5, this->width(i), output);
  }

  // repeated .caffe.BlobShape shape = 6;
  for (unsigned int i = 0, n = this->shape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->shape(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.DummyDataParameter)
}